

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QMetaTypeInterface ** __thiscall
QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::operator[]
          (QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *this,QByteArray *key)

{
  QMetaTypeInterface **ppQVar1;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffb8;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  ppQVar1 = iterator::operator*((iterator *)0x3a75d3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ppQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }